

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
equalize_histogram(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                  vector<int,_std::allocator<int>_> *iterations_histogram,int max_iterations)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  pointer pfVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  pointer piVar8;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  float fVar12;
  vector<int,_std::allocator<int>_> cdf;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,
             (long)(iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_41);
  piVar2 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 != piVar3) {
    iVar5 = *piVar2;
    *local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = iVar5;
    piVar7 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar11 = piVar2;
    while (piVar11 = piVar11 + 1, piVar11 != piVar3) {
      piVar7 = piVar7 + 1;
      iVar5 = iVar5 + *piVar11;
      *piVar7 = iVar5;
    }
  }
  uVar6 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  piVar8 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar10 = uVar6;
  if (0 < (long)uVar6 >> 4) {
    piVar8 = (pointer)((uVar6 & 0xfffffffffffffff0) +
                      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    lVar9 = ((long)uVar6 >> 4) + 1;
    piVar11 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 2;
    do {
      if (0 < piVar11[-2]) {
        piVar11 = piVar11 + -2;
        goto LAB_001069dc;
      }
      if (0 < piVar11[-1]) {
        piVar11 = piVar11 + -1;
        goto LAB_001069dc;
      }
      if (0 < *piVar11) goto LAB_001069dc;
      if (0 < piVar11[1]) {
        piVar11 = piVar11 + 1;
        goto LAB_001069dc;
      }
      lVar9 = lVar9 + -1;
      piVar11 = piVar11 + 4;
    } while (1 < lVar9);
    uVar10 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar8;
  }
  lVar9 = (long)uVar10 >> 2;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      piVar11 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((lVar9 != 3) || (piVar11 = piVar8, 0 < *piVar8)) goto LAB_001069dc;
      piVar8 = piVar8 + 1;
    }
    piVar11 = piVar8;
    if (0 < *piVar8) goto LAB_001069dc;
    piVar8 = piVar8 + 1;
  }
  piVar11 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  if (0 < *piVar8) {
    piVar11 = piVar8;
  }
LAB_001069dc:
  iVar5 = *(int *)((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (uVar6 - 4));
  iVar1 = *piVar11;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(long)piVar3 - (long)piVar2 >> 2,(allocator_type *)&local_41);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pfVar4 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      if (*piVar8 < 1) {
        fVar12 = 0.0;
      }
      else {
        fVar12 = (float)(*piVar8 - *piVar11) * ((float)max_iterations / (float)(iVar5 - iVar1));
      }
      *pfVar4 = fVar12;
      piVar8 = piVar8 + 1;
      pfVar4 = pfVar4 + 1;
    } while (piVar8 != local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> equalize_histogram(const std::vector<int>& iterations_histogram, const int max_iterations)
{
    // Calculate the CDF (Cumulative Distribution Function) by accumulating all iteration counts.
    // Element [0] is unused and iterations_histogram[max_iterations] should be zero (as we do not count
    // the iterations of the points inside the Mandelbrot Set).
    std::vector<int> cdf(iterations_histogram.size());
    std::partial_sum(iterations_histogram.cbegin(), iterations_histogram.cend(), cdf.begin());

    // Get the minimum value in the CDF that is bigger than zero and the sum of all iteration counts
    // from iterations_histogram (which is the last value of the CDF).
    const auto cdf_min = std::find_if(cdf.cbegin(), cdf.cend(), [](auto n) { return n > 0; });
    const auto total_iterations = cdf[cdf.size() - 1];

    // normalize all values from the CDF that are bigger than zero to a range of 0.0 .. max_iterations
    const auto f = static_cast<float>(max_iterations) / static_cast<float>(total_iterations - *cdf_min);
    std::vector<float> equalized_iterations(iterations_histogram.size());
    std::transform(cdf.cbegin(), cdf.cend(), equalized_iterations.begin(),
                   [=](const auto& c) { return c > 0 ? f * static_cast<float>(c - *cdf_min) : 0.0f; });

    return equalized_iterations;
}